

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

ssl_ticket_aead_result_t
bssl::ssl_process_ticket
          (SSL_HANDSHAKE *hs,UniquePtr<SSL_SESSION> *out_session,bool *out_renew_ticket,
          Span<const_unsigned_char> ticket,Span<const_unsigned_char> session_id)

{
  char cVar1;
  SSL *ssl;
  SSL_HANDSHAKE_HINTS *pSVar2;
  ssl_ctx_st *psVar3;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *this;
  undefined8 __p;
  bool bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  int iVar7;
  ptrdiff_t _Num;
  size_t sVar8;
  ssl_ticket_aead_result_t sVar9;
  ptrdiff_t _Num_2;
  Span<const_unsigned_char> ticket_00;
  Span<const_unsigned_char> ticket_01;
  UniquePtr<SSL_SESSION> session;
  Array<unsigned_char> local_178;
  SSL_SESSION *local_160;
  uchar *local_158;
  HMAC_CTX *local_150;
  uint local_144;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *local_140;
  undefined1 local_138 [160];
  EVP_MD *local_98;
  
  local_158 = (uchar *)ticket.size_;
  ssl = hs->ssl;
  *out_renew_ticket = false;
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)out_session,(pointer)0x0);
  uVar6 = SSL_get_options(hs->ssl);
  if ((uVar6 >> 0xe & 1) != 0) {
    return ssl_ticket_aead_ignore_ticket;
  }
  if (0x20 < session_id.size_) {
    return ssl_ticket_aead_ignore_ticket;
  }
  local_150 = (HMAC_CTX *)ticket.data_;
  local_140 = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)out_session;
  uVar5 = ssl_protocol_version(ssl);
  local_144 = (uint)uVar5;
  local_178.data_ = (uchar *)0x0;
  local_178.size_ = 0;
  pSVar2 = (hs->hints)._M_t.
           super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
  if (pSVar2 == (SSL_HANDSHAKE_HINTS *)0x0 || local_144 < 0x304) {
    if ((uVar5 < 0x304 && pSVar2 != (SSL_HANDSHAKE_HINTS *)0x0) && ((hs->field_0x6ca & 0x10) == 0))
    {
      sVar8 = (pSVar2->decrypted_ticket).size_;
      if (sVar8 == 0) {
        cVar1 = pSVar2->ignore_ticket;
        goto joined_r0x0013a05d;
      }
      local_160 = (SSL_SESSION *)(pSVar2->decrypted_ticket).data_;
      bVar4 = Array<unsigned_char>::InitUninitialized(&local_178,sVar8);
      sVar9 = ssl_ticket_aead_error;
      if (bVar4) {
        memmove(local_178.data_,local_160,sVar8);
        *out_renew_ticket = pSVar2->renew_ticket;
        goto LAB_0013a034;
      }
      goto LAB_0013a1b8;
    }
LAB_0013a063:
    psVar3 = (ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    if (psVar3->ticket_aead_method == (SSL_TICKET_AEAD_METHOD *)0x0) {
      sVar9 = ssl_ticket_aead_ignore_ticket;
      if ((uchar *)0x1f < local_158) {
        if (psVar3->ticket_key_cb ==
            (_func_int_SSL_ptr_uint8_t_ptr_uint8_t_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)0x0) {
          ticket_01.size_ = (size_t)local_158;
          ticket_01.data_ = (uchar *)local_150;
          sVar9 = ssl_decrypt_ticket_with_ticket_keys(hs,&local_178,ticket_01);
        }
        else {
          EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_138);
          HMAC_CTX_init((HMAC_CTX *)&stack0xffffffffffffff68);
          sVar8 = 0;
          iVar7 = (*((hs->ssl->session_ctx)._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_key_cb)
                            (hs->ssl,(uint8_t *)local_150,(uint8_t *)&(local_150->md_ctx).md_data,
                             (EVP_CIPHER_CTX *)local_138,(HMAC_CTX *)&stack0xffffffffffffff68,0);
          if (iVar7 < 0) {
            sVar9 = ssl_ticket_aead_error;
          }
          else if (iVar7 == 0) {
            sVar9 = ssl_ticket_aead_ignore_ticket;
          }
          else {
            if (iVar7 != 1) {
              if (iVar7 != 2) {
                __assert_fail("cb_ret == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                              ,0x10e2,
                              "enum ssl_ticket_aead_result_t bssl::ssl_decrypt_ticket_with_cb(SSL_HANDSHAKE *, Array<uint8_t> *, bool *, Span<const uint8_t>)"
                             );
              }
              *out_renew_ticket = true;
            }
            ticket_00.size_ = sVar8;
            ticket_00.data_ = local_158;
            sVar9 = decrypt_ticket_with_cipher_ctx
                              ((bssl *)&local_178,(Array<unsigned_char> *)local_138,
                               (EVP_CIPHER_CTX *)&stack0xffffffffffffff68,local_150,ticket_00);
          }
          HMAC_CTX_cleanup((HMAC_CTX *)&stack0xffffffffffffff68);
          EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_138);
        }
      }
    }
    else {
      local_138._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
      local_138._8_8_ = (EVP_MD *)0x0;
      bVar4 = Array<unsigned_char>::InitUninitialized
                        ((Array<unsigned_char> *)local_138,(size_t)local_158);
      sVar9 = ssl_ticket_aead_error;
      if ((bVar4) &&
         (sVar9 = (*((hs->ssl->session_ctx)._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_aead_method->
                    open)(hs->ssl,(uint8_t *)local_138._0_8_,(size_t *)&stack0xffffffffffffff68,
                          (size_t)local_158,(uint8_t *)local_150,(size_t)local_158),
         sVar9 == ssl_ticket_aead_success)) {
        if ((ulong)local_138._8_8_ < local_98) {
          abort();
        }
        local_138._8_8_ = local_98;
        OPENSSL_free(local_178.data_);
        local_178.data_ = (uchar *)local_138._0_8_;
        local_178.size_ = local_138._8_8_;
        local_138._0_8_ = (_Head_base<0UL,_ssl_session_st_*,_false>)0x0;
        local_138._8_8_ = (EVP_MD *)0x0;
      }
      OPENSSL_free((void *)local_138._0_8_);
    }
    if (pSVar2 != (SSL_HANDSHAKE_HINTS *)0x0) goto LAB_0013a1b8;
LAB_0013a1c2:
    if (sVar9 != ssl_ticket_aead_success) goto LAB_0013a2cc;
  }
  else {
    if ((hs->field_0x6ca & 0x10) != 0) goto LAB_0013a063;
    sVar8 = (pSVar2->decrypted_psk).size_;
    if (sVar8 == 0) {
      cVar1 = pSVar2->ignore_psk;
joined_r0x0013a05d:
      sVar9 = ssl_ticket_aead_ignore_ticket;
      if (cVar1 == '\0') goto LAB_0013a063;
    }
    else {
      local_160 = (SSL_SESSION *)(pSVar2->decrypted_psk).data_;
      bVar4 = Array<unsigned_char>::InitUninitialized(&local_178,sVar8);
      sVar9 = ssl_ticket_aead_error;
      if (bVar4) {
        memmove(local_178.data_,local_160,sVar8);
LAB_0013a034:
        sVar9 = ssl_ticket_aead_success;
      }
    }
LAB_0013a1b8:
    sVar8 = local_178.size_;
    if ((hs->field_0x6ca & 0x10) == 0) goto LAB_0013a1c2;
    if (sVar9 != ssl_ticket_aead_success) {
      if (sVar9 == ssl_ticket_aead_ignore_ticket) {
        if (local_144 < 0x304) {
          pSVar2->ignore_ticket = true;
        }
        else {
          pSVar2->ignore_psk = true;
        }
        sVar9 = ssl_ticket_aead_ignore_ticket;
      }
      goto LAB_0013a2cc;
    }
    local_160 = (SSL_SESSION *)local_178.data_;
    if (local_144 < 0x304) {
      bVar4 = Array<unsigned_char>::InitUninitialized(&pSVar2->decrypted_ticket,local_178.size_);
      if (bVar4 && (EVP_MD *)sVar8 != (EVP_MD *)0x0) {
        memmove((pSVar2->decrypted_ticket).data_,local_160,sVar8);
      }
      sVar9 = ssl_ticket_aead_error;
      if (!bVar4) goto LAB_0013a2cc;
      pSVar2->renew_ticket = *out_renew_ticket;
    }
    else {
      bVar4 = Array<unsigned_char>::InitUninitialized(&pSVar2->decrypted_psk,local_178.size_);
      if (bVar4 && (EVP_MD *)sVar8 != (EVP_MD *)0x0) {
        memmove((pSVar2->decrypted_psk).data_,local_160,sVar8);
      }
      sVar9 = ssl_ticket_aead_error;
      if (!bVar4) goto LAB_0013a2cc;
    }
  }
  local_138._0_8_ =
       SSL_SESSION_from_bytes
                 (local_178.data_,local_178.size_,
                  (ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  this = local_140;
  if ((tuple<ssl_session_st_*,_bssl::internal::Deleter>)local_138._0_8_ ==
      (_Head_base<0UL,_ssl_session_st_*,_false>)0x0) {
    sVar9 = ssl_ticket_aead_ignore_ticket;
    ERR_clear_error();
  }
  else {
    (((ssl_session_st *)local_138._0_8_)->session_id).size_ = ' ';
    SHA256((uchar *)local_150,(size_t)local_158,
           (uchar *)&((ssl_session_st *)local_138._0_8_)->session_id);
    __p = local_138._0_8_;
    local_138._0_8_ = (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)0x0;
    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset(this,(pointer)__p);
    sVar9 = ssl_ticket_aead_success;
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_138);
LAB_0013a2cc:
  OPENSSL_free(local_178.data_);
  return sVar9;
}

Assistant:

enum ssl_ticket_aead_result_t ssl_process_ticket(
    SSL_HANDSHAKE *hs, UniquePtr<SSL_SESSION> *out_session,
    bool *out_renew_ticket, Span<const uint8_t> ticket,
    Span<const uint8_t> session_id) {
  SSL *const ssl = hs->ssl;
  *out_renew_ticket = false;
  out_session->reset();

  if ((SSL_get_options(hs->ssl) & SSL_OP_NO_TICKET) ||
      session_id.size() > SSL_MAX_SSL_SESSION_ID_LENGTH) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Tickets in TLS 1.3 are tied into pre-shared keys (PSKs), unlike in TLS 1.2
  // where that concept doesn't exist. The |decrypted_psk| and |ignore_psk|
  // hints only apply to PSKs. We check the version to determine which this is.
  const bool is_psk = ssl_protocol_version(ssl) >= TLS1_3_VERSION;

  Array<uint8_t> plaintext;
  enum ssl_ticket_aead_result_t result;
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (is_psk && hints && !hs->hints_requested &&
      !hints->decrypted_psk.empty()) {
    result = plaintext.CopyFrom(hints->decrypted_psk) ? ssl_ticket_aead_success
                                                      : ssl_ticket_aead_error;
  } else if (is_psk && hints && !hs->hints_requested && hints->ignore_psk) {
    result = ssl_ticket_aead_ignore_ticket;
  } else if (!is_psk && hints && !hs->hints_requested &&
             !hints->decrypted_ticket.empty()) {
    if (plaintext.CopyFrom(hints->decrypted_ticket)) {
      result = ssl_ticket_aead_success;
      *out_renew_ticket = hints->renew_ticket;
    } else {
      result = ssl_ticket_aead_error;
    }
  } else if (!is_psk && hints && !hs->hints_requested && hints->ignore_ticket) {
    result = ssl_ticket_aead_ignore_ticket;
  } else if (ssl->session_ctx->ticket_aead_method != NULL) {
    result = ssl_decrypt_ticket_with_method(hs, &plaintext, out_renew_ticket,
                                            ticket);
  } else {
    // Ensure there is room for the key name and the largest IV |ticket_key_cb|
    // may try to consume. The real limit may be lower, but the maximum IV
    // length should be well under the minimum size for the session material and
    // HMAC.
    if (ticket.size() < SSL_TICKET_KEY_NAME_LEN + EVP_MAX_IV_LENGTH) {
      result = ssl_ticket_aead_ignore_ticket;
    } else if (ssl->session_ctx->ticket_key_cb != NULL) {
      result =
          ssl_decrypt_ticket_with_cb(hs, &plaintext, out_renew_ticket, ticket);
    } else {
      result = ssl_decrypt_ticket_with_ticket_keys(hs, &plaintext, ticket);
    }
  }

  if (hints && hs->hints_requested) {
    if (result == ssl_ticket_aead_ignore_ticket) {
      if (is_psk) {
        hints->ignore_psk = true;
      } else {
        hints->ignore_ticket = true;
      }
    } else if (result == ssl_ticket_aead_success) {
      if (is_psk) {
        if (!hints->decrypted_psk.CopyFrom(plaintext)) {
          return ssl_ticket_aead_error;
        }
      } else {
        if (!hints->decrypted_ticket.CopyFrom(plaintext)) {
          return ssl_ticket_aead_error;
        }
        hints->renew_ticket = *out_renew_ticket;
      }
    }
  }

  if (result != ssl_ticket_aead_success) {
    return result;
  }

  // Decode the session.
  UniquePtr<SSL_SESSION> session(SSL_SESSION_from_bytes(
      plaintext.data(), plaintext.size(), ssl->ctx.get()));
  if (!session) {
    ERR_clear_error();  // Don't leave an error on the queue.
    return ssl_ticket_aead_ignore_ticket;
  }

  // Envoy's tests expect the session to have a session ID that matches the
  // placeholder used by the client. It's unclear whether this is a good idea,
  // but we maintain it for now.
  session->session_id.ResizeForOverwrite(SHA256_DIGEST_LENGTH);
  SHA256(ticket.data(), ticket.size(), session->session_id.data());

  *out_session = std::move(session);
  return ssl_ticket_aead_success;
}